

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_sparse.c
# Opt level: O0

void verify_archive_file(char *name,archive_contents *ac)

{
  wchar_t wVar1;
  int iVar2;
  archive_entry *entry;
  long *in_RSI;
  undefined8 in_RDI;
  char c;
  contents *cts;
  archive *a;
  void *p;
  contents actual;
  contents expect;
  int err;
  archive_entry *ae;
  char *in_stack_00000390;
  archive *in_stack_ffffffffffffff78;
  archive_entry *o;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  archive *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  wchar_t in_stack_ffffffffffffff94;
  long *in_stack_ffffffffffffff98;
  char *pcVar3;
  long *plVar4;
  char *in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  archive *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  wchar_t utf8;
  void *in_stack_ffffffffffffffc8;
  long local_30;
  archive_entry *local_18;
  long *local_10;
  
  extract_reference_file(in_stack_00000390);
  entry = (archive_entry *)archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  archive_read_support_filter_all(in_stack_ffffffffffffff78);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  archive_read_support_format_tar(in_stack_ffffffffffffffb8);
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  failure("Can\'t open %s",in_RDI);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (char *)in_stack_ffffffffffffff88,
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
  local_10 = in_RSI;
  while( true ) {
    utf8 = (wchar_t)in_stack_ffffffffffffffc8;
    if (*local_10 == 0) {
      archive_read_next_header
                ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (archive_entry **)in_stack_ffffffffffffff78);
      assertion_equal_int((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                          (longlong)in_stack_ffffffffffffff88,
                          (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (longlong)entry,(char *)0x17b9fc,in_stack_ffffffffffffffb0);
      archive_read_close((archive *)0x17ba06);
      assertion_equal_int((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                          (longlong)in_stack_ffffffffffffff88,
                          (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                          (longlong)entry,(char *)0x17ba35,in_stack_ffffffffffffffb0);
      archive_read_free((archive *)0x17ba3f);
      assertion_equal_int((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                          (longlong)in_stack_ffffffffffffff88,
                          (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                          (char *)0x17ba6d,in_stack_ffffffffffffffb0);
      return;
    }
    pcVar3 = (char *)local_10[1];
    archive_read_next_header
              ((archive *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (archive_entry **)in_stack_ffffffffffffff78);
    o = entry;
    wVar1 = assertion_equal_int(pcVar3,in_stack_ffffffffffffff94,(longlong)in_stack_ffffffffffffff88
                                ,(char *)CONCAT44(in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80),(longlong)entry,
                                (char *)0x17b5a1,in_stack_ffffffffffffffb0);
    if (wVar1 == L'\0') break;
    failure("Name mismatch in archive %s",in_RDI);
    in_stack_ffffffffffffff88 = (archive *)*local_10;
    archive_entry_pathname(entry);
    in_stack_ffffffffffffff80 = 0;
    assertion_equal_string
              (in_stack_ffffffffffffffa8,(wchar_t)((ulong)o >> 0x20),pcVar3,
               (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)in_stack_ffffffffffffff88,(char *)((ulong)in_stack_ffffffffffffff84 << 0x20),
               in_stack_ffffffffffffffc0,utf8);
    archive_entry_is_encrypted(local_18);
    assertion_equal_int(pcVar3,in_stack_ffffffffffffff94,(longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                        (char *)0x17b684,in_stack_ffffffffffffffb0);
    archive_read_has_encrypted_entries(in_stack_ffffffffffffff88);
    entry = o;
    assertion_equal_int(pcVar3,in_stack_ffffffffffffff94,(longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (longlong)o,(char *)0x17b6c0,in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffff98 = (long *)(pcVar3 + 0x18);
    in_stack_ffffffffffffffc8 = *(void **)pcVar3;
    local_30 = *(long *)(pcVar3 + 8);
    while (iVar2 = archive_read_data_block
                             ((archive *)
                              CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                              (void **)in_stack_ffffffffffffff88,
                              (size_t *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              (int64_t *)o), pcVar3 = in_stack_ffffffffffffffa8, iVar2 == 0) {
      for (; in_stack_ffffffffffffffc0 = pcVar3, in_stack_ffffffffffffffb8 != (archive *)0x0;
          in_stack_ffffffffffffffb8 = (archive *)((long)&in_stack_ffffffffffffffb8[-1].sconv + 7)) {
        in_stack_ffffffffffffff94 = CONCAT13(*pcVar3,(int3)in_stack_ffffffffffffff94);
        if ((long)in_stack_ffffffffffffffb0 < (long)in_stack_ffffffffffffffc8) {
          failure("%s: pad at offset %d should be zero",in_RDI,in_stack_ffffffffffffffb0);
          o = (archive_entry *)0x0;
          assertion_equal_int((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                              (longlong)in_stack_ffffffffffffff88,
                              (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              0,(char *)0x17b792,in_stack_ffffffffffffffb0);
          plVar4 = in_stack_ffffffffffffff98;
        }
        else {
          if (in_stack_ffffffffffffffb0 != in_stack_ffffffffffffffc8) {
            failure("%s: Unexpected trailing data",in_RDI);
            assertion_assert((char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             (wchar_t)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                             (wchar_t)in_stack_ffffffffffffff88,
                             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),o
                            );
            archive_read_free((archive *)0x17b88d);
            return;
          }
          o = (archive_entry *)0x0;
          assertion_equal_int((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                              (longlong)in_stack_ffffffffffffff88,
                              (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              0,(char *)0x17b7df,in_stack_ffffffffffffffb0);
          in_stack_ffffffffffffffc8 = (void *)((long)in_stack_ffffffffffffffc8 + 1);
          local_30 = local_30 + -1;
          plVar4 = in_stack_ffffffffffffff98;
          if (local_30 == 0) {
            plVar4 = in_stack_ffffffffffffff98 + 3;
            in_stack_ffffffffffffffc8 = (void *)*in_stack_ffffffffffffff98;
            local_30 = in_stack_ffffffffffffff98[1];
          }
        }
        in_stack_ffffffffffffffb0 = (void *)((long)in_stack_ffffffffffffffb0 + 1);
        in_stack_ffffffffffffff98 = plVar4;
        pcVar3 = pcVar3 + 1;
      }
    }
    failure("%s: should be end of entry",in_RDI);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        (longlong)entry,(char *)0x17b911,in_stack_ffffffffffffffb0);
    failure("%s: Size returned at EOF must be zero",in_RDI);
    assertion_equal_int((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                        (char *)0x17b95b,in_stack_ffffffffffffffb0);
    failure("%s: Offset of final empty chunk must be same as file size",in_RDI);
    in_stack_ffffffffffffff78 = (archive *)0x0;
    assertion_equal_int((char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                        (longlong)in_stack_ffffffffffffff88,
                        (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                        (char *)0x17b9a4,in_stack_ffffffffffffffb0);
    local_10 = local_10 + 2;
  }
  archive_read_free((archive *)0x17b5b0);
  assertion_equal_int(pcVar3,in_stack_ffffffffffffff94,(longlong)in_stack_ffffffffffffff88,
                      (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),0,
                      (char *)0x17b5de,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void
verify_archive_file(const char *name, struct archive_contents *ac)
{
	struct archive_entry *ae;
	int err;
	/* data, size, offset of next expected block. */
	struct contents expect;
	/* data, size, offset of block read from archive. */
	struct contents actual;
	const void *p;
	struct archive *a;

	extract_reference_file(name);

	assert((a = archive_read_new()) != NULL);
	assert(0 == archive_read_support_filter_all(a));
	assert(0 == archive_read_support_format_tar(a));
	failure("Can't open %s", name);
	assert(0 == archive_read_open_filename(a, name, 3));

	while (ac->filename != NULL) {
		struct contents *cts = ac->contents;

		if (!assertEqualIntA(a, 0, archive_read_next_header(a, &ae))) {
			assertEqualInt(ARCHIVE_OK, archive_read_free(a));
			return;
		}
		failure("Name mismatch in archive %s", name);
		assertEqualString(ac->filename, archive_entry_pathname(ae));
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		expect = *cts++;
		while (0 == (err = archive_read_data_block(a,
				 &p, &actual.s, &actual.o))) {
			actual.d = p;
			while (actual.s > 0) {
				char c = *actual.d;
				if(actual.o < expect.o) {
					/*
					 * Any byte before the expected
					 * data must be NULL.
					 */
					failure("%s: pad at offset %d "
					    "should be zero", name, actual.o);
					assertEqualInt(c, 0);
				} else if (actual.o == expect.o) {
					/*
					 * Data at matching offsets must match.
					 */
					assertEqualInt(c, *expect.d);
					expect.d++;
					expect.o++;
					expect.s--;
					/* End of expected? step to next expected. */
					if (expect.s <= 0)
						expect = *cts++;
				} else {
					/*
					 * We found data beyond that expected.
					 */
					failure("%s: Unexpected trailing data",
					    name);
					assert(actual.o <= expect.o);
					archive_read_free(a);
					return;
				}
				actual.d++;
				actual.o++;
				actual.s--;
			}
		}
		failure("%s: should be end of entry", name);
		assertEqualIntA(a, err, ARCHIVE_EOF);
		failure("%s: Size returned at EOF must be zero", name);
		assertEqualInt((int)actual.s, 0);
		failure("%s: Offset of final empty chunk must be same as file size", name);
		assertEqualInt(actual.o, expect.o);
		/* Step to next file description. */
		++ac;
	}

	err = archive_read_next_header(a, &ae);
	assertEqualIntA(a, ARCHIVE_EOF, err);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}